

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void realpath_cb(uv_fs_t *req)

{
  int iVar1;
  size_t sVar2;
  uv_fs_t *unaff_RBX;
  int flags;
  char *__s1;
  size_t test_file_abs_size;
  char test_file_abs_buf [4096];
  size_t asStack_1228 [3];
  uv_fs_t uStack_1210;
  uv_fs_t *puStack_1058;
  size_t local_1020;
  char local_1018 [7];
  undefined4 auStack_1011 [1024];
  
  local_1020 = 0x1000;
  if (req->fs_type == UV_FS_REALPATH) {
    unaff_RBX = req;
    if (req->result == 0) {
      uv_cwd(local_1018,&local_1020);
      sVar2 = strlen(local_1018);
      builtin_strncpy(local_1018 + sVar2,"/test_fi",8);
      *(undefined4 *)((long)auStack_1011 + sVar2) = 0x656c69;
      __s1 = (char *)req->ptr;
      iVar1 = strcmp(__s1,local_1018);
      flags = (int)__s1;
      if (iVar1 == 0) {
        realpath_cb_count = realpath_cb_count + 1;
        uv_fs_req_cleanup(req);
        return;
      }
      goto LAB_0015ca94;
    }
  }
  else {
    realpath_cb_cold_1();
  }
  flags = (int)req;
  realpath_cb_cold_2();
LAB_0015ca94:
  realpath_cb_cold_3();
  puStack_1058 = unaff_RBX;
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  rmdir("test_dir_symlink");
  asStack_1228[0] = 0x1000;
  loop = uv_default_loop();
  uv_fs_mkdir((uv_loop_t *)0x0,&uStack_1210,"test_dir",0x1ff,(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_1210);
  uv_cwd(test_symlink_dir_impl::test_dir_abs_buf,asStack_1228);
  sVar2 = strlen(test_symlink_dir_impl::test_dir_abs_buf);
  builtin_strncpy(test_symlink_dir_impl::test_dir_abs_buf + sVar2,"/test_di",8);
  (test_symlink_dir_impl::test_dir_abs_buf + sVar2 + 8)[0] = 'r';
  (test_symlink_dir_impl::test_dir_abs_buf + sVar2 + 8)[1] = '\0';
  asStack_1228[0] = asStack_1228[0] + 9;
  iVar1 = uv_fs_symlink((uv_loop_t *)0x0,&uStack_1210,"test_dir","test_dir_symlink",flags,
                        (uv_fs_cb)0x0);
  if ((flags == 1) && ((iVar1 == -1 || (iVar1 == -0x5f)))) {
    test_symlink_dir_impl_cold_1();
  }
  else {
    test_symlink_dir_impl_cold_2();
  }
  return;
}

Assistant:

static void realpath_cb(uv_fs_t* req) {
  char test_file_abs_buf[PATHMAX];
  size_t test_file_abs_size = sizeof(test_file_abs_buf);
  ASSERT(req->fs_type == UV_FS_REALPATH);
#ifdef _WIN32
  /*
   * Windows XP and Server 2003 don't support GetFinalPathNameByHandleW()
   */
  if (req->result == UV_ENOSYS) {
    realpath_cb_count++;
    uv_fs_req_cleanup(req);
    return;
  }
#endif
  ASSERT(req->result == 0);

  uv_cwd(test_file_abs_buf, &test_file_abs_size);
#ifdef _WIN32
  strcat(test_file_abs_buf, "\\test_file");
  ASSERT(stricmp(req->ptr, test_file_abs_buf) == 0);
#else
  strcat(test_file_abs_buf, "/test_file");
  ASSERT(strcmp(req->ptr, test_file_abs_buf) == 0);
#endif
  realpath_cb_count++;
  uv_fs_req_cleanup(req);
}